

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O1

void __thiscall
CTxMemPoolEntry::UpdateDescendantState
          (CTxMemPoolEntry *this,int32_t modifySize,CAmount modifyFee,int64_t modifyCount)

{
  int64_t *piVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  piVar1 = &this->nSizeWithDescendants;
  lVar2 = *piVar1;
  *piVar1 = *piVar1 + (long)modifySize;
  if (*piVar1 == 0 || SCARRY8(lVar2,(long)modifySize) != *piVar1 < 0) {
    __assert_fail("nSizeWithDescendants > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txmempool.cpp"
                  ,0x17f,"void CTxMemPoolEntry::UpdateDescendantState(int32_t, CAmount, int64_t)");
  }
  lVar2 = this->nModFeesWithDescendants;
  lVar4 = 0x7fffffffffffffff;
  if (lVar2 < 1 || modifyFee <= 0x7fffffffffffffff - lVar2) {
    lVar4 = -0x8000000000000000;
    if (-0x8000000000000000 - lVar2 <= modifyFee) {
      lVar4 = lVar2 + modifyFee;
    }
    if (-1 < lVar2) {
      lVar4 = lVar2 + modifyFee;
    }
  }
  this->nModFeesWithDescendants = lVar4;
  piVar1 = &this->m_count_with_descendants;
  lVar2 = *piVar1;
  *piVar1 = *piVar1 + modifyCount;
  if (*piVar1 != 0 && SCARRY8(lVar2,modifyCount) == *piVar1 < 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("m_count_with_descendants > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txmempool.cpp"
                ,0x182,"void CTxMemPoolEntry::UpdateDescendantState(int32_t, CAmount, int64_t)");
}

Assistant:

void CTxMemPoolEntry::UpdateDescendantState(int32_t modifySize, CAmount modifyFee, int64_t modifyCount)
{
    nSizeWithDescendants += modifySize;
    assert(nSizeWithDescendants > 0);
    nModFeesWithDescendants = SaturatingAdd(nModFeesWithDescendants, modifyFee);
    m_count_with_descendants += modifyCount;
    assert(m_count_with_descendants > 0);
}